

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSingleLumpFont::LoadBMF(FSingleLumpFont *this,int lump,BYTE *data)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  CharData *pCVar5;
  BYTE *pBVar6;
  FFontChar2 *this_00;
  int iVar7;
  byte *pbVar8;
  byte *pbVar9;
  long lVar10;
  PalEntry *local_768;
  PalEntry *pal;
  PalEntry sort_palette [256];
  BYTE raw_palette [768];
  int local_40;
  int chari;
  int i;
  int infolen;
  int nwidth;
  int totalwidth;
  int count;
  int numchars;
  BYTE *chardata;
  BYTE *data_local;
  int lump_local;
  FSingleLumpFont *this_local;
  
  local_768 = (PalEntry *)&pal;
  do {
    PalEntry::PalEntry(local_768);
    local_768 = local_768 + 1;
  } while (local_768 != sort_palette + 0xfe);
  this->FontType = BMFFONT;
  (this->super_FFont).FontHeight = (uint)data[5];
  (this->super_FFont).GlobalKerning = (int)(char)data[8];
  (this->super_FFont).ActiveColors = (uint)data[0x10];
  (this->super_FFont).SpaceWidth = -1;
  i = -1;
  this->RescalePalette = true;
  pbVar8 = data + (long)(int)(uint)data[(this->super_FFont).ActiveColors * 3 + 0x11] +
                  (long)((this->super_FFont).ActiveColors * 3) + 0x12;
  iVar7 = (uint)*pbVar8 + (uint)pbVar8[1] * 0x100;
  pbVar9 = pbVar8 + 2;
  (this->super_FFont).FirstChar = 0x100;
  (this->super_FFont).LastChar = 0;
  infolen = 0;
  raw_palette[0x2fc] = '\0';
  raw_palette[0x2fd] = '\0';
  raw_palette[0x2fe] = '\0';
  raw_palette[0x2ff] = '\0';
  for (local_40 = 0; local_40 < iVar7; local_40 = local_40 + 1) {
    if (((pbVar9[raw_palette._764_4_ + 1] != 0) && (pbVar9[raw_palette._764_4_ + 2] != 0)) ||
       (pbVar9[raw_palette._764_4_ + 5] != 0)) {
      if ((int)(uint)pbVar9[(int)raw_palette._764_4_] < (this->super_FFont).FirstChar) {
        (this->super_FFont).FirstChar = (uint)pbVar9[(int)raw_palette._764_4_];
      }
      if ((this->super_FFont).LastChar < (int)(uint)pbVar9[(int)raw_palette._764_4_]) {
        (this->super_FFont).LastChar = (uint)pbVar9[(int)raw_palette._764_4_];
      }
      infolen = (uint)pbVar9[raw_palette._764_4_ + 1] + infolen;
    }
    raw_palette._764_4_ =
         (uint)pbVar9[raw_palette._764_4_ + 1] * (uint)pbVar9[raw_palette._764_4_ + 2] + 6 +
         raw_palette._764_4_;
  }
  if ((this->super_FFont).LastChar < (this->super_FFont).FirstChar) {
    I_FatalError("BMF font defines no characters");
  }
  iVar3 = ((this->super_FFont).LastChar - (this->super_FFont).FirstChar) + 1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pCVar5 = (CharData *)operator_new__(uVar4);
  (this->super_FFont).Chars = pCVar5;
  for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
    (this->super_FFont).Chars[local_40].Pic = (FTexture *)0x0;
    (this->super_FFont).Chars[local_40].XMove = -0x80000000;
  }
  for (local_40 = 0; iVar1 = (this->super_FFont).ActiveColors,
      SBORROW4(local_40,iVar1 * 3) != local_40 + iVar1 * -3 < 0; local_40 = local_40 + 1) {
    *(byte *)((long)&sort_palette[0xfe].field_0 + (long)(local_40 + 3)) =
         data[local_40 + 0x11] << 2 | (byte)((int)(uint)data[local_40 + 0x11] >> 4);
  }
  (this->super_FFont).ActiveColors = (this->super_FFont).ActiveColors + 1;
  for (local_40 = 0; local_40 < (this->super_FFont).ActiveColors; local_40 = local_40 + 1) {
    lVar10 = (long)local_40;
    sort_palette[lVar10 + -2].field_0.field_0.a = (BYTE)local_40;
    sort_palette[lVar10 + -2].field_0.field_0.r =
         *(BYTE *)((long)&sort_palette[0xfe].field_0 + (long)(local_40 * 3));
    sort_palette[lVar10 + -2].field_0.field_0.g =
         *(BYTE *)((long)&sort_palette[0xfe].field_0 + (long)(local_40 * 3 + 1));
    sort_palette[lVar10 + -2].field_0.field_0.b =
         *(BYTE *)((long)&sort_palette[0xfe].field_0 + (long)(local_40 * 3 + 2));
  }
  qsort((void *)((long)&pal + 4),(long)((this->super_FFont).ActiveColors + -1),4,BMFCompare);
  pBVar6 = (BYTE *)operator_new__((long)(this->super_FFont).ActiveColors);
  (this->super_FFont).PatchRemap = pBVar6;
  *(this->super_FFont).PatchRemap = '\0';
  for (local_40 = 1; local_40 < (this->super_FFont).ActiveColors; local_40 = local_40 + 1) {
    (this->super_FFont).PatchRemap[sort_palette[(long)local_40 + -2].field_0.field_0.a] =
         (BYTE)local_40;
  }
  memcpy(this->PaletteData,sort_palette + 0xfe,0x300);
  raw_palette[0x2fc] = '\0';
  raw_palette[0x2fd] = '\0';
  raw_palette[0x2fe] = '\0';
  raw_palette[0x2ff] = '\0';
  local_40 = 0;
  while( true ) {
    if (iVar7 <= local_40) {
      if ((this->super_FFont).SpaceWidth < 0) {
        if (i < 0) {
          (this->super_FFont).SpaceWidth = (infolen << 1) / (iVar3 * 3);
        }
        else {
          (this->super_FFont).SpaceWidth = i;
        }
      }
      FFont::FixXMoves(&this->super_FFont);
      (*(this->super_FFont)._vptr_FFont[4])();
      return;
    }
    if ((int)((uint)pbVar9[(int)raw_palette._764_4_] - (this->super_FFont).FirstChar) < 0) break;
    if (iVar3 <= (int)((uint)pbVar9[(int)raw_palette._764_4_] - (this->super_FFont).FirstChar)) {
      __assert_fail("chardata[chari] - FirstChar < count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                    ,0x508,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
    }
    if (pbVar9[(int)raw_palette._764_4_] == 0x20) {
      (this->super_FFont).SpaceWidth = (uint)pbVar9[raw_palette._764_4_ + 5];
    }
    else if (pbVar9[(int)raw_palette._764_4_] == 0x4e) {
      i = (int)pbVar9[raw_palette._764_4_ + 5];
    }
    (this->super_FFont).Chars
    [(int)((uint)pbVar9[(int)raw_palette._764_4_] - (this->super_FFont).FirstChar)].XMove =
         (uint)pbVar9[raw_palette._764_4_ + 5];
    if ((pbVar9[raw_palette._764_4_ + 1] != 0) && (pbVar9[raw_palette._764_4_ + 2] != 0)) {
      this_00 = (FFontChar2 *)operator_new(0x78);
      lVar10 = (long)(int)raw_palette._764_4_;
      chardata._0_4_ = (int)data;
      FFontChar2::FFontChar2
                (this_00,lump,(((int)pbVar9 + raw_palette._764_4_) - (int)chardata) + 6,
                 (uint)pbVar8[lVar10 + 3],(uint)pbVar8[lVar10 + 4],-(int)(char)pbVar8[lVar10 + 5],
                 -(int)(char)pbVar8[lVar10 + 6]);
      (this->super_FFont).Chars
      [(int)((uint)pbVar9[(int)raw_palette._764_4_] - (this->super_FFont).FirstChar)].Pic =
           (FTexture *)this_00;
    }
    local_40 = local_40 + 1;
    raw_palette._764_4_ =
         (uint)pbVar9[raw_palette._764_4_ + 1] * (uint)pbVar9[raw_palette._764_4_ + 2] + 6 +
         raw_palette._764_4_;
  }
  __assert_fail("chardata[chari] - FirstChar >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                ,0x507,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
}

Assistant:

void FSingleLumpFont::LoadBMF(int lump, const BYTE *data)
{
	const BYTE *chardata;
	int numchars, count, totalwidth, nwidth;
	int infolen;
	int i, chari;
	BYTE raw_palette[256*3];
	PalEntry sort_palette[256];

	FontType = BMFFONT;
	FontHeight = data[5];
	GlobalKerning = (SBYTE)data[8];
	ActiveColors = data[16];
	SpaceWidth = -1;
	nwidth = -1;
	RescalePalette = true;

	infolen = data[17 + ActiveColors*3];
	chardata = data + 18 + ActiveColors*3 + infolen;
	numchars = chardata[0] + 256*chardata[1];
	chardata += 2;

	// Scan for lowest and highest characters defined and total font width.
	FirstChar = 256;
	LastChar = 0;
	totalwidth = 0;
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		if ((chardata[chari+1] == 0 || chardata[chari+2] == 0) && chardata[chari+5] == 0)
		{ // Don't count empty characters.
			continue;
		}
		if (chardata[chari] < FirstChar)
		{
			FirstChar = chardata[chari];
		}
		if (chardata[chari] > LastChar)
		{
			LastChar = chardata[chari];
		}
		totalwidth += chardata[chari+1];
	}
	if (LastChar < FirstChar)
	{
		I_FatalError("BMF font defines no characters");
	}
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	for (i = 0; i < count; ++i)
	{
		Chars[i].Pic = NULL;
		Chars[i].XMove = INT_MIN;
	}

	// BMF palettes are only six bits per component. Fix that.
	for (i = 0; i < ActiveColors*3; ++i)
	{
		raw_palette[i+3] = (data[17 + i] << 2) | (data[17 + i] >> 4);
	}
	ActiveColors++;

	// Sort the palette by increasing brightness
	for (i = 0; i < ActiveColors; ++i)
	{
		PalEntry *pal = &sort_palette[i];
		pal->a = i;		// Use alpha part to point back to original entry
		pal->r = raw_palette[i*3 + 0];
		pal->g = raw_palette[i*3 + 1];
		pal->b = raw_palette[i*3 + 2];
	}
	qsort(sort_palette + 1, ActiveColors - 1, sizeof(PalEntry), BMFCompare);

	// Create the PatchRemap table from the sorted "alpha" values.
	PatchRemap = new BYTE[ActiveColors];
	PatchRemap[0] = 0;
	for (i = 1; i < ActiveColors; ++i)
	{
		PatchRemap[sort_palette[i].a] = i;
	}

	memcpy(PaletteData, raw_palette, 768);

	// Now scan through the characters again, creating glyphs for each one.
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		assert(chardata[chari] - FirstChar >= 0);
		assert(chardata[chari] - FirstChar < count);
		if (chardata[chari] == ' ')
		{
			SpaceWidth = chardata[chari+5];
		}
		else if (chardata[chari] == 'N')
		{
			nwidth = chardata[chari+5];
		}
		Chars[chardata[chari] - FirstChar].XMove = chardata[chari+5];
		if (chardata[chari+1] == 0 || chardata[chari+2] == 0)
		{ // Empty character: skip it.
			continue;
		}
		Chars[chardata[chari] - FirstChar].Pic = new FFontChar2(lump, int(chardata + chari + 6 - data),
			chardata[chari+1],	// width
			chardata[chari+2],	// height
			-(SBYTE)chardata[chari+3],	// x offset
			-(SBYTE)chardata[chari+4]	// y offset
		);
	}

	// If the font did not define a space character, determine a suitable space width now.
	if (SpaceWidth < 0)
	{
		if (nwidth >= 0)
		{
			SpaceWidth = nwidth;
		}
		else
		{
			SpaceWidth = totalwidth * 2 / (3 * count);
		}
	}

	FixXMoves();
	LoadTranslations();
}